

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O0

void google::protobuf::
     STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::TextFormat::ParseInfoTree**,std::vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>>>
               (__normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
                begin,__normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
                      end)

{
  ParseInfoTree *this;
  bool bVar1;
  reference ppPVar2;
  __normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
  local_20;
  __normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
  temp;
  __normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
  end_local;
  __normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
  begin_local;
  
  temp._M_current = end._M_current;
  end_local._M_current = begin._M_current;
  while (bVar1 = __gnu_cxx::operator!=(&end_local,&temp), bVar1) {
    local_20._M_current = end_local._M_current;
    __gnu_cxx::
    __normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
    ::operator++(&end_local);
    ppPVar2 = __gnu_cxx::
              __normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
              ::operator*(&local_20);
    this = *ppPVar2;
    if (this != (ParseInfoTree *)0x0) {
      TextFormat::ParseInfoTree::~ParseInfoTree(this);
      operator_delete(this,0x60);
    }
  }
  return;
}

Assistant:

void STLDeleteContainerPointers(ForwardIterator begin,
                                ForwardIterator end) {
  while (begin != end) {
    ForwardIterator temp = begin;
    ++begin;
    delete *temp;
  }
}